

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall GdlRule::FixGlyphAttrsInRules(GdlRule *this,GrcManager *pcman,GrcFont *pfont)

{
  GrcSymbolTableEntry *this_00;
  pointer ppGVar1;
  GdlRule *this_01;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer ppGVar5;
  bool bVar6;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> vpglfcInClasses;
  GdlGlyphClassDefn *pglfc;
  void *local_88;
  iterator iStack_80;
  GdlGlyphClassDefn **local_78;
  GdlGlyphClassDefn *local_70;
  GdlRule *local_68;
  GrcFont *local_60;
  pointer local_58;
  undefined5 *local_50;
  undefined8 local_48;
  undefined5 local_40;
  undefined3 uStack_3b;
  undefined5 uStack_38;
  undefined1 local_33;
  
  local_88 = (void *)0x0;
  iStack_80._M_current = (GdlGlyphClassDefn **)0x0;
  local_78 = (GdlGlyphClassDefn **)0x0;
  ppGVar5 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_68 = this;
  local_60 = pfont;
  if (ppGVar5 != local_58) {
    do {
      this_00 = (*ppGVar5)->m_psymInput;
      if (this_00 == (GrcSymbolTableEntry *)0x0) {
LAB_0012f61d:
        bVar2 = false;
        bVar6 = false;
      }
      else {
        bVar2 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtClass);
        if (!bVar2) {
          bVar2 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialLb);
          if (!bVar2) goto LAB_0012f61d;
        }
        uStack_38 = 0x2a64656e69;
        local_40 = 0x6e5543472a;
        uStack_3b = 0x666564;
        local_48 = 0xd;
        local_33 = 0;
        bVar2 = true;
        local_50 = &local_40;
        if ((this_00->m_staFieldName)._M_string_length == 0xd) {
          iVar3 = bcmp((this_00->m_staFieldName)._M_dataplus._M_p,&local_40,0xd);
          bVar6 = iVar3 != 0;
        }
        else {
          bVar6 = true;
        }
      }
      if ((bVar2) && (local_50 != &local_40)) {
        operator_delete(local_50,CONCAT35(uStack_3b,local_40) + 1);
      }
      if (bVar6) {
        local_70 = GrcSymbolTableEntry::GlyphClassDefnData(this_00);
        if (iStack_80._M_current == local_78) {
          std::vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>>::
          _M_realloc_insert<GdlGlyphClassDefn*const&>
                    ((vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>> *)&local_88,
                     iStack_80,&local_70);
        }
        else {
          *iStack_80._M_current = local_70;
LAB_0012f682:
          iStack_80._M_current = iStack_80._M_current + 1;
        }
      }
      else {
        local_70 = (GdlGlyphClassDefn *)0x0;
        if (iStack_80._M_current != local_78) {
          *iStack_80._M_current = (GdlGlyphClassDefn *)0x0;
          goto LAB_0012f682;
        }
        std::vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>>::
        _M_realloc_insert<GdlGlyphClassDefn*>
                  ((vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>> *)&local_88,
                   iStack_80,&local_70);
      }
      ppGVar5 = ppGVar5 + 1;
    } while (ppGVar5 != local_58);
  }
  this_01 = local_68;
  ppGVar1 = (local_68->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppGVar5 = (local_68->m_vprit).
                 super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppGVar5 != ppGVar1; ppGVar5 = ppGVar5 + 1) {
    (*(*ppGVar5)->_vptr_GdlRuleItem[0xb])(*ppGVar5,pcman);
  }
  FixFeatureTestsInRules(this_01,local_60);
  ppGVar5 = (this_01->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppGVar1 = (this_01->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar5 != ppGVar1) {
    uVar4 = 0;
    do {
      (*(*ppGVar5)->_vptr_GdlRuleItem[10])(*ppGVar5,pcman,&local_88,local_68,(ulong)uVar4);
      uVar4 = uVar4 + 1;
      ppGVar5 = ppGVar5 + 1;
    } while (ppGVar5 != ppGVar1);
  }
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return;
}

Assistant:

void GdlRule::FixGlyphAttrsInRules(GrcManager * pcman, GrcFont * pfont)
{
	//	Make a list of all the input-classes in the rule, for checking for the definition
	//	of glyph attributes in constraints and attribute-setters.
	std::vector<GdlGlyphClassDefn *> vpglfcInClasses;
	for (auto const prit: m_vprit)
	{
		Symbol psymInput = prit->m_psymInput;
		if (psymInput &&
			(psymInput->FitsSymbolType(ksymtClass) ||
				psymInput->FitsSymbolType(ksymtSpecialLb)) &&
				!psymInput->LastFieldIs(GdlGlyphClassDefn::Undefined()))
		{
			GdlGlyphClassDefn * pglfc = psymInput->GlyphClassDefnData();
			Assert(pglfc);
			vpglfcInClasses.push_back(pglfc);
		}
		else
			//	invalid input class
			vpglfcInClasses.push_back(NULL);
	}
	Assert(m_vprit.size() == vpglfcInClasses.size());

	//	Flatten slot attributes that use points to use integers instead. Do this
	//	entire process before fixing glyph attrs, because there can be some interaction between
	//	slots in a rule (eg, attach.to/at). So we can be sure at that point what state
	//	things are in.
	for (auto const prit: m_vprit)
	{
		prit->FlattenPointSlotAttrs(pcman);
	}

	//	While we're at it, fix the feature tests. Do this before fixing the glyph attributes,
	//	because it is possible to have feature tests embedded in conditional statements.
	FixFeatureTestsInRules(pfont);

	//	Now do the fixes, error checks, etc.
	auto index = 0;
	for (auto const prit: m_vprit)
	{
		prit->FixGlyphAttrsInRules(pcman, vpglfcInClasses, this, index++);
	}
}